

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffghadll(fitsfile *fptr,LONGLONG *headstart,LONGLONG *datastart,LONGLONG *dataend,int *status)

{
  int iVar1;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if (fptr->Fptr->datastart == -1) {
      iVar1 = ffrdef(fptr,status);
      goto LAB_00180900;
    }
  }
  else {
    iVar1 = ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
LAB_00180900:
    if (0 < iVar1) goto LAB_0018094a;
  }
  if (headstart != (LONGLONG *)0x0) {
    *headstart = fptr->Fptr->headstart[fptr->Fptr->curhdu];
  }
  if (datastart != (LONGLONG *)0x0) {
    *datastart = fptr->Fptr->datastart;
  }
  if (dataend != (LONGLONG *)0x0) {
    *dataend = fptr->Fptr->headstart[(long)fptr->Fptr->curhdu + 1];
  }
LAB_0018094a:
  return *status;
}

Assistant:

int ffghadll(fitsfile *fptr,     /* I - FITS file pointer                     */
            LONGLONG *headstart, /* O - byte offset to beginning of CHDU      */
            LONGLONG *datastart, /* O - byte offset to beginning of next HDU  */
            LONGLONG *dataend,   /* O - byte offset to beginning of next HDU  */
            int *status)         /* IO - error status     */
/*
  Return the address (= byte offset) in the FITS file to the beginning of
  the current HDU, the beginning of the data unit, and the end of the data unit.
*/
{
    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        if (ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status) > 0)
            return(*status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        if (ffrdef(fptr, status) > 0)           /* rescan header */
            return(*status);
    }

    if (headstart)
        *headstart = (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu];       

    if (datastart)
        *datastart = (fptr->Fptr)->datastart;

    if (dataend)
        *dataend = (fptr->Fptr)->headstart[((fptr->Fptr)->curhdu) + 1];       

    return(*status);
}